

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::CreationErrorsTest::iterate(CreationErrorsTest *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  GLenum GVar5;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  ContextInfo *this_00;
  ErrorsUtilities *pEVar7;
  TestContext *this_01;
  GLuint texture;
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  this_00 = ((this->super_TestCase).m_context)->m_contextInfo;
  bVar3 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar2) || (bVar3)) {
    texture = 0;
    pcVar1 = *(code **)(lVar6 + 0x400);
    GVar5 = NotATarget((CreationErrorsTest *)this_00);
    pEVar7 = (ErrorsUtilities *)(ulong)GVar5;
    (*pcVar1)(pEVar7,1,&texture);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar7,(this->super_TestCase).m_context,0x500,"glCreateTextures",
                       "target is not one of the allowable values.");
    if (texture != 0) {
      (**(code **)(lVar6 + 0x480))(1,&texture);
      texture = 0;
    }
    pEVar7 = (ErrorsUtilities *)0xde1;
    (**(code **)(lVar6 + 0x400))(0xde1,0xffffffffffffffff,&texture);
    bVar3 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar7,(this->super_TestCase).m_context,0x501,"glCreateTextures",
                       "n is negative.");
    if (texture != 0) {
      (**(code **)(lVar6 + 0x480))(1);
    }
    do {
      iVar4 = (**(code **)(lVar6 + 0x800))();
    } while (iVar4 != 0);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar2 && bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Textures' objects */
	glw::GLuint texture = 0;

	try
	{
		/* Not a target test. */
		gl.createTextures(NotATarget(), 1, &texture);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glCreateTextures",
								  "target is not one of the allowable values.");

		if (texture)
		{
			gl.deleteTextures(1, &texture);

			texture = 0;
		}

		/* Negative number of textures. */
		gl.createTextures(GL_TEXTURE_2D, -1, &texture);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCreateTextures", "n is negative.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}